

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void generate_random_data(uint16_t *data,uint32_t n)

{
  uint in_ESI;
  long in_RDI;
  int i;
  uniform_int_distribution<unsigned_short> distr;
  mt19937 eng;
  random_device rd;
  undefined4 in_stack_ffffffffffffd8b8;
  unsigned_short in_stack_ffffffffffffd8bc;
  result_type in_stack_ffffffffffffd8be;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  uint local_2734;
  random_device *in_stack_ffffffffffffd900;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1398;
  uint local_c;
  long local_8;
  
  this = &local_1398;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::random_device::random_device(in_stack_ffffffffffffd900);
  std::random_device::operator()((random_device *)0x152422);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (this,CONCAT26(in_stack_ffffffffffffd8be,
                           CONCAT24(in_stack_ffffffffffffd8bc,in_stack_ffffffffffffd8b8)));
  std::numeric_limits<unsigned_short>::max();
  std::uniform_int_distribution<unsigned_short>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_short> *)this,in_stack_ffffffffffffd8be,
             in_stack_ffffffffffffd8bc);
  for (local_2734 = 0; local_2734 < local_c; local_2734 = local_2734 + 1) {
    in_stack_ffffffffffffd8be =
         std::uniform_int_distribution<unsigned_short>::operator()
                   ((uniform_int_distribution<unsigned_short> *)this,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT26(in_stack_ffffffffffffd8be,
                                CONCAT24(in_stack_ffffffffffffd8bc,in_stack_ffffffffffffd8b8)));
    *(result_type *)(local_8 + (long)(int)local_2734 * 2) = in_stack_ffffffffffffd8be;
  }
  std::random_device::~random_device((random_device *)0x1524d2);
  return;
}

Assistant:

void generate_random_data(uint16_t* data, uint32_t n) {
    std::random_device rd; // obtain a random number from hardware
    std::mt19937 eng(rd()); // seed the generator

    std::uniform_int_distribution<uint16_t> distr(0, std::numeric_limits<uint16_t>::max()-1); // right inclusive

    for (int i = 0; i < n; ++i) {
        data[i] = distr(eng);
    }
}